

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_align.h
# Opt level: O2

void free_aligned(void *ptr,size_t size)

{
  munmap(ptr,size + 0x3f & 0xffffffffffffffc0);
  return;
}

Assistant:

static inline void
free_aligned(void* ptr, size_t size)
{
    // make sure size is a multiple of LINE_SIZE
    size = (size + LINE_SIZE - 1) & (~(LINE_SIZE - 1));
#if SYLVAN_USE_MMAP
    munmap(ptr, size);
#elif defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    _aligned_free(ptr);
#elif defined(__MINGW32__)
    __mingw_aligned_free(ptr);
#else
    free(ptr);
#endif
    (void)size; // suppress unused parameter
}